

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomNurbsCurves *geom,uint32_t indent,
          bool closing_brace)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  undefined3 in_register_00000081;
  uint32_t indent_00;
  uint indent_01;
  stringstream ss;
  allocator local_211;
  string local_210;
  uint32_t local_1ec;
  undefined1 local_1e8 [64];
  ostream local_1a8 [376];
  
  indent_00 = CONCAT31(in_register_00000081,closing_brace);
  local_1ec = indent;
  local_1e8._40_8_ = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 0x30));
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)geom & 0xffffffff),n);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
  to_string_abi_cxx11_((string *)local_1e8,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar3 = ::std::operator<<(poVar3,(string *)local_1e8);
  poVar3 = ::std::operator<<(poVar3," NurbsCurves \"");
  poVar3 = ::std::operator<<(poVar3,(string *)(this + 0xa78));
  ::std::operator<<(poVar3,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  bVar2 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  n_02 = n_00;
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)geom & 0xffffffff),n_00);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::operator<<(poVar3,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_(&local_210,this + 0x1a10,(PrimMeta *)(ulong)((int)geom + 1),indent);
    ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)geom & 0xffffffff),n_01);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::operator<<(poVar3,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  indent_01 = (int)geom + 1;
  local_1e8._32_8_ = (ulong)geom & 0xffffffff;
  pprint::Indent_abi_cxx11_(&local_210,(pprint *)((ulong)geom & 0xffffffff),n_02);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::operator<<(poVar3,"{\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"points",&local_211);
  print_typed_attr<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
            (&local_210,this + 0x2848,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"normals",&local_211);
  print_typed_attr<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
            (&local_210,this + 0x25d0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"widths",&local_211);
  print_typed_attr<std::vector<float,std::allocator<float>>>
            (&local_210,this + 0x2ac0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_> *)
             local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"velocites",&local_211);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_210,this + 0x20e0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"accelerations",&local_211);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            (&local_210,this + 0x1e68,
             (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"curveVertexCounts",&local_211);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_210,this + 0x2358,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"order",&local_211);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            (&local_210,this + 0x2d38,
             (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
             local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"knots",&local_211);
  print_typed_attr<std::vector<double,std::allocator<double>>>
            (&local_210,this + 0x2fb0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_> *
             )local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"ranges",&local_211);
  print_typed_attr<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
            (&local_210,this + 0x3228,
             (TypedAttribute<tinyusdz::Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
              *)local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::string((string *)local_1e8,"pointWeights",&local_211);
  print_typed_attr<std::vector<double,std::allocator<double>>>
            (&local_210,this + 0x34a0,
             (TypedAttribute<tinyusdz::Animatable<std::vector<double,_std::allocator<double>_>_>_> *
             )local_1e8,(string *)(ulong)indent_01,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_gprim_predefined<tinyusdz::GeomNurbsCurves>(&local_210,(GeomNurbsCurves *)this,indent_01);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  print_props(&local_210,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),indent_01);
  ::std::operator<<(local_1a8,(string *)&local_210);
  ::std::__cxx11::string::_M_dispose();
  if ((char)local_1ec != '\0') {
    pprint::Indent_abi_cxx11_(&local_210,(pprint *)local_1e8._32_8_,n_03);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_210);
    ::std::operator<<(poVar3,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  uVar1 = local_1e8._40_8_;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 0x30));
  return (string *)uVar1;
}

Assistant:

std::string to_string(const GeomNurbsCurves &geom, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(geom.spec) << " NurbsCurves \""
     << geom.name << "\"\n";
  if (geom.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(geom.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(geom.points, "points", indent + 1);
  ss << print_typed_attr(geom.normals, "normals", indent + 1);
  ss << print_typed_attr(geom.widths, "widths", indent + 1);
  ss << print_typed_attr(geom.velocities, "velocites", indent + 1);
  ss << print_typed_attr(geom.accelerations, "accelerations", indent + 1);
  ss << print_typed_attr(geom.curveVertexCounts, "curveVertexCounts",
                         indent + 1);

  //
  ss << print_typed_attr(geom.order, "order", indent + 1);
  ss << print_typed_attr(geom.knots, "knots", indent + 1);
  ss << print_typed_attr(geom.ranges, "ranges", indent + 1);
  ss << print_typed_attr(geom.pointWeights, "pointWeights", indent + 1);

  ss << print_gprim_predefined(geom, indent + 1);

  ss << print_props(geom.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}